

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_discard_rectangles
          (Impl *this,Value *state,VkPipelineDiscardRectangleStateCreateInfoEXT **out_info)

{
  bool bVar1;
  uint uVar2;
  VkDiscardRectangleModeEXT VVar3;
  VkPipelineDiscardRectangleStateCreateInfoEXT *pVVar4;
  Type pGVar5;
  
  pVVar4 = ScratchAllocator::allocate_cleared<VkPipelineDiscardRectangleStateCreateInfoEXT>
                     (&this->allocator);
  *out_info = pVVar4;
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"flags");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar5);
  pVVar4->flags = uVar2;
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"discardRectangleMode");
  VVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar5);
  pVVar4->discardRectangleMode = VVar3;
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"discardRectangleCount");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar5);
  pVVar4->discardRectangleCount = uVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"discardRectangles");
  if (bVar1) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"discardRectangles");
    parse_scissors(this,pGVar5,&pVVar4->pDiscardRectangles);
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_discard_rectangles(const Value &state,
                                                   VkPipelineDiscardRectangleStateCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineDiscardRectangleStateCreateInfoEXT>();
	*out_info = info;

	info->flags = static_cast<VkPipelineDiscardRectangleStateCreateFlagsEXT>(state["flags"].GetUint());
	info->discardRectangleMode = static_cast<VkDiscardRectangleModeEXT>(state["discardRectangleMode"].GetUint());
	info->discardRectangleCount = state["discardRectangleCount"].GetUint();

	// Could be null for dynamic state.
	if (state.HasMember("discardRectangles"))
	{
		if (!parse_scissors(state["discardRectangles"], &info->pDiscardRectangles))
			return false;
	}

	return true;
}